

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::relaxedNmaddF16x8
          (Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  Literal *right_local;
  Literal *left_local;
  Literal *this_local;
  
  anon_unknown_0::ternary<8,_&wasm::Literal::getLanesF16x8,_&wasm::Literal::nmadd,_&wasm::toFP16>
            (__return_storage_ptr__,this,left,right);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::relaxedNmaddF16x8(const Literal& left,
                                   const Literal& right) const {
  return ternary<8, &Literal::getLanesF16x8, &Literal::nmadd, &toFP16>(
    *this, left, right);
}